

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v10::detail::assert_fail(char *file,int line,char *message)

{
  char *message_local;
  int line_local;
  char *file_local;
  
  fprintf(_stderr,"%s:%d: assertion failed: %s",file,(ulong)(uint)line,message);
  std::terminate();
}

Assistant:

FMT_FUNC void assert_fail(const char* file, int line, const char* message) {
  // Use unchecked std::fprintf to avoid triggering another assertion when
  // writing to stderr fails
  std::fprintf(stderr, "%s:%d: assertion failed: %s", file, line, message);
  // Chosen instead of std::abort to satisfy Clang in CUDA mode during device
  // code pass.
  std::terminate();
}